

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

Instr * __thiscall
Inline::InlineApplyWithoutArrayArgument
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *applyInfo,
          FunctionJITTimeInfo *applyTargetInfo)

{
  code *pcVar1;
  FunctionJITTimeInfo *this_00;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  RegOpnd *dstOpnd;
  IntConstOpnd *src1Opnd;
  Instr *pIVar5;
  Opnd *pOVar6;
  Opnd *src2Opnd;
  ByteCodeUsesInstr *this_01;
  ByteCodeUsesInstr *bytecodeUses;
  bool safeThis;
  StackSym *pSStack_88;
  bool callTargetOpndIsJITOpt;
  StackSym *callTargetStackSym;
  Instr *thisArgOut;
  SymOpnd *linkOpnd;
  StackSym *symDst;
  Instr *startCall;
  Instr *instr;
  Instr *pIStack_50;
  uint argOutCount;
  Instr *dummyInstr;
  Instr *explicitThisArgOut;
  Instr *implicitThisArgOut;
  Instr *instrNext;
  FunctionJITTimeInfo *applyTargetInfo_local;
  FunctionJITTimeInfo *applyInfo_local;
  Instr *callInstr_local;
  Inline *this_local;
  
  implicitThisArgOut = callInstr->m_next;
  explicitThisArgOut = (Instr *)0x0;
  dummyInstr = (Instr *)0x0;
  pIStack_50 = (Instr *)0x0;
  instr._4_4_ = 0;
  instrNext = (Instr *)applyTargetInfo;
  applyTargetInfo_local = applyInfo;
  applyInfo_local = (FunctionJITTimeInfo *)callInstr;
  callInstr_local = (Instr *)this;
  GetArgInstrsForCallAndApply
            (this,callInstr,&explicitThisArgOut,&dummyInstr,&stack0xffffffffffffffb0,
             (uint *)((long)&instr + 4));
  if (explicitThisArgOut == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xacd,"(implicitThisArgOut)","implicitThisArgOut");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (dummyInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xace,"(explicitThisArgOut)","explicitThisArgOut");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  EmitFixedMethodOrFunctionObjectChecksForBuiltIns
            (this,(Instr *)applyInfo_local,(Instr *)applyInfo_local,applyTargetInfo_local,false,true
             ,false,true);
  startCall = InsertInlineeBuiltInStartEndTags(this,(Instr *)applyInfo_local,2,(Instr **)0x0);
  startCall->m_opcode = InlineNonTrackingBuiltInEnd;
  dstOpnd = IR::RegOpnd::New(TyVar,(Func *)(applyInfo_local->m_data).sharedPropertyGuards);
  src1Opnd = IR::IntConstOpnd::New
                       (1,TyInt32,(Func *)(applyInfo_local->m_data).sharedPropertyGuards,false);
  symDst = (StackSym *)
           IR::Instr::New(StartCall,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,
                          (Func *)(applyInfo_local->m_data).sharedPropertyGuards);
  IR::Instr::InsertBefore((Instr *)applyInfo_local,(Instr *)symDst);
  linkOpnd = (SymOpnd *)
             SymTable::GetArgSlotSym
                       (*(SymTable **)((applyInfo_local->m_data).sharedPropertyGuards + 0x6e),1);
  pIVar5 = (Instr *)IR::SymOpnd::New((Sym *)linkOpnd,0,TyVar,
                                     (Func *)(applyInfo_local->m_data).sharedPropertyGuards);
  thisArgOut = pIVar5;
  pOVar6 = IR::Instr::GetSrc1(dummyInstr);
  src2Opnd = IR::Instr::GetDst((Instr *)symDst);
  callTargetStackSym =
       (StackSym *)
       IR::Instr::New(ArgOut_A,(Opnd *)pIVar5,pOVar6,src2Opnd,
                      (Func *)(applyInfo_local->m_data).sharedPropertyGuards);
  IR::Instr::InsertBefore((Instr *)applyInfo_local,(Instr *)callTargetStackSym);
  this_00 = applyInfo_local;
  pOVar6 = IR::Instr::GetSrc1(explicitThisArgOut);
  IR::Instr::ReplaceSrc1((Instr *)this_00,pOVar6);
  IR::Instr::ReplaceSrc2((Instr *)applyInfo_local,(Opnd *)thisArgOut);
  *(undefined2 *)&(applyInfo_local->m_data).inlineeCount = 0x1f;
  pOVar6 = IR::Instr::GetSrc1((Instr *)applyInfo_local);
  pSStack_88 = IR::Opnd::GetStackSym(pOVar6);
  pOVar6 = IR::Instr::GetSrc1((Instr *)applyInfo_local);
  bytecodeUses._7_1_ = IR::Opnd::GetIsJITOptimizedReg(pOVar6);
  while( true ) {
    bVar3 = StackSym::IsSingleDef(pSStack_88);
    bVar2 = false;
    if (bVar3) {
      pIVar5 = StackSym::GetInstrDef(pSStack_88);
      bVar2 = pIVar5->m_opcode == BytecodeArgOutCapture;
    }
    if (!bVar2) break;
    pIVar5 = StackSym::GetInstrDef(pSStack_88);
    pOVar6 = IR::Instr::GetSrc1(pIVar5);
    bytecodeUses._7_1_ = IR::Opnd::GetIsJITOptimizedReg(pOVar6);
    pIVar5 = StackSym::GetInstrDef(pSStack_88);
    pOVar6 = IR::Instr::GetSrc1(pIVar5);
    pSStack_88 = IR::Opnd::GetStackSym(pOVar6);
  }
  bVar2 = StackSym::IsSingleDef(pSStack_88);
  if (bVar2) {
    if (instrNext == (Instr *)0x0) {
      this_local = (Inline *)implicitThisArgOut;
    }
    else {
      bytecodeUses._6_1_ = 0;
      bVar2 = TryOptimizeCallInstrWithFixedMethod
                        (this,(Instr *)applyInfo_local,(FunctionJITTimeInfo *)instrNext,false,false,
                         false,true,(bool *)((long)&bytecodeUses + 6),false,0);
      if (bVar2) {
        if ((short)(applyInfo_local->m_data).inlineeCount != 0x26f) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0xaf9,"(callInstr->m_opcode == Js::OpCode::CallIFixed)",
                             "callInstr->m_opcode == Js::OpCode::CallIFixed");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        this_01 = IR::ByteCodeUsesInstr::New((Instr *)applyInfo_local);
        IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
                  (this_01,(bool)(bytecodeUses._7_1_ & 1),(pSStack_88->super_Sym).m_id);
        IR::Instr::InsertBefore((Instr *)applyInfo_local,&this_01->super_Instr);
      }
      this_local = (Inline *)implicitThisArgOut;
    }
  }
  else {
    this_local = (Inline *)implicitThisArgOut;
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr * Inline::InlineApplyWithoutArrayArgument(IR::Instr *callInstr, const FunctionJITTimeInfo * applyInfo, const FunctionJITTimeInfo * applyTargetInfo)
{
    IR::Instr * instrNext = callInstr->m_next;
    IR::Instr * implicitThisArgOut = nullptr;
    IR::Instr * explicitThisArgOut = nullptr;
    IR::Instr * dummyInstr = nullptr;
    uint argOutCount = 0;
    this->GetArgInstrsForCallAndApply(callInstr, &implicitThisArgOut, &explicitThisArgOut, &dummyInstr, argOutCount);

    Assert(implicitThisArgOut);
    Assert(explicitThisArgOut);

    EmitFixedMethodOrFunctionObjectChecksForBuiltIns(callInstr, callInstr, applyInfo, false /*isPolymorphic*/, true /*isBuiltIn*/, false /*isCtor*/, true /*isInlined*/);

    IR::Instr *instr = InsertInlineeBuiltInStartEndTags(callInstr, 2); // 2 args (implicit this + explicit this)
    instr->m_opcode = Js::OpCode::InlineNonTrackingBuiltInEnd;

    IR::Instr * startCall = IR::Instr::New(Js::OpCode::StartCall,
        IR::RegOpnd::New(TyVar, callInstr->m_func),
        IR::IntConstOpnd::New(1, TyInt32, callInstr->m_func),
        callInstr->m_func);
    callInstr->InsertBefore(startCall);

    StackSym* symDst = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(1));
    IR::SymOpnd* linkOpnd = IR::SymOpnd::New(symDst, 0, TyVar, callInstr->m_func);
    IR::Instr* thisArgOut = IR::Instr::New(Js::OpCode::ArgOut_A, linkOpnd, explicitThisArgOut->GetSrc1(), startCall->GetDst(), callInstr->m_func);
    callInstr->InsertBefore(thisArgOut);

    callInstr->ReplaceSrc1(implicitThisArgOut->GetSrc1());
    callInstr->ReplaceSrc2(linkOpnd);
    callInstr->m_opcode = Js::OpCode::CallI;

    StackSym* callTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool callTargetOpndIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();
    while (callTargetStackSym->IsSingleDef() && callTargetStackSym->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture)
    {
        callTargetOpndIsJITOpt = callTargetStackSym->GetInstrDef()->GetSrc1()->GetIsJITOptimizedReg();
        callTargetStackSym = callTargetStackSym->GetInstrDef()->GetSrc1()->GetStackSym();
    }

    if (!callTargetStackSym->IsSingleDef())
    {
        return instrNext;
    }

    if (!applyTargetInfo)
    {
        return instrNext;
    }

    bool safeThis = false;
    if (TryOptimizeCallInstrWithFixedMethod(callInstr, applyTargetInfo, false /*isPolymorphic*/, false /*isBuiltIn*/, false /*isCtor*/, true /*isInlined*/, safeThis /*unused here*/))
    {
        Assert(callInstr->m_opcode == Js::OpCode::CallIFixed);
        IR::ByteCodeUsesInstr* bytecodeUses = IR::ByteCodeUsesInstr::New(callInstr);
        bytecodeUses->SetRemovedOpndSymbol(callTargetOpndIsJITOpt, callTargetStackSym->m_id);
        callInstr->InsertBefore(bytecodeUses);
    }

    return instrNext;
}